

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cStencilTexturingTests.cpp
# Opt level: O2

bool __thiscall
gl4cts::StencilTexturing::FunctionalTest::test
          (FunctionalTest *this,GLenum internal_format,bool is_stencil)

{
  bool bVar1;
  int iVar2;
  GLuint dst_texture_id;
  GLuint dst_texture_id_00;
  GLuint program_id;
  GLuint src_texture_id;
  undefined4 extraout_var;
  FunctionalTest *this_00;
  bool local_71;
  GLuint local_6c;
  GLuint local_68;
  vector<unsigned_char,_std::allocator<unsigned_char>_> texture_data;
  long lVar3;
  
  this_00 = (FunctionalTest *)((this->super_TestCase).m_context)->m_renderCtx;
  iVar2 = (*(this_00->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[3])();
  lVar3 = CONCAT44(extraout_var,iVar2);
  texture_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  texture_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  texture_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  prepareSourceTextureData(this_00,internal_format,&texture_data);
  bVar1 = Utils::isExtensionSupported((this->super_TestCase).m_context,"GL_ARB_compute_shader");
  local_71 = true;
  local_6c = 0;
  local_68 = 0;
  dst_texture_id = 0;
  if (bVar1) {
    dst_texture_id = prepareDestinationTexture(this,is_stencil);
    local_68 = prepareProgram(this,false,is_stencil);
    local_6c = prepareSourceTexture(this,internal_format,is_stencil,&texture_data);
    dispatch(this,local_68,is_stencil,dst_texture_id,local_6c);
    local_71 = verifyTexture(this,dst_texture_id,internal_format,is_stencil,&texture_data);
  }
  dst_texture_id_00 = prepareDestinationTexture(this,is_stencil);
  program_id = prepareProgram(this,true,is_stencil);
  src_texture_id = prepareSourceTexture(this,internal_format,is_stencil,&texture_data);
  draw(this,program_id,dst_texture_id_00,src_texture_id);
  bVar1 = verifyTexture(this,dst_texture_id_00,internal_format,is_stencil,&texture_data);
  (**(code **)(lVar3 + 0xd8))(0);
  (**(code **)(lVar3 + 0x78))(0x8ca9,0);
  (**(code **)(lVar3 + 0x1680))(0);
  Utils::deleteProgram((this->super_TestCase).m_context,local_68);
  Utils::deleteProgram((this->super_TestCase).m_context,program_id);
  Utils::deleteTexture((this->super_TestCase).m_context,dst_texture_id);
  Utils::deleteTexture((this->super_TestCase).m_context,local_6c);
  Utils::deleteTexture((this->super_TestCase).m_context,dst_texture_id_00);
  Utils::deleteTexture((this->super_TestCase).m_context,src_texture_id);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&texture_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return (bool)(local_71 & bVar1);
}

Assistant:

bool FunctionalTest::test(GLenum internal_format, bool is_stencil)
{
	GLuint				 compute_dst_tex_id = 0;
	GLuint				 compute_program_id = 0;
	GLuint				 compute_src_tex_id = 0;
	GLuint				 draw_dst_tex_id	= 0;
	GLuint				 draw_program_id	= 0;
	GLuint				 draw_src_tex_id	= 0;
	const Functions&	 gl					= m_context.getRenderContext().getFunctions();
	bool				 test_result		= true;
	std::vector<GLubyte> texture_data;

	prepareSourceTextureData(internal_format, texture_data);

	try
	{
		if (true == Utils::isExtensionSupported(m_context, "GL_ARB_compute_shader"))
		{
			compute_dst_tex_id = prepareDestinationTexture(is_stencil);
			compute_program_id = prepareProgram(false, is_stencil);
			compute_src_tex_id = prepareSourceTexture(internal_format, is_stencil, texture_data);

			dispatch(compute_program_id, is_stencil, compute_dst_tex_id, compute_src_tex_id);

			if (false == verifyTexture(compute_dst_tex_id, internal_format, is_stencil, texture_data))
			{
				test_result = false;
			}
		}

		{
			draw_dst_tex_id = prepareDestinationTexture(is_stencil);
			draw_program_id = prepareProgram(true, is_stencil);
			draw_src_tex_id = prepareSourceTexture(internal_format, is_stencil, texture_data);

			draw(draw_program_id, draw_dst_tex_id, draw_src_tex_id);

			if (false == verifyTexture(draw_dst_tex_id, internal_format, is_stencil, texture_data))
			{
				test_result = false;
			}
		}
	}
	catch (std::exception& exc)
	{
		gl.bindVertexArray(0);
		gl.bindFramebuffer(GL_DRAW_FRAMEBUFFER, 0);
		gl.useProgram(0);

		Utils::deleteProgram(m_context, compute_program_id);
		Utils::deleteProgram(m_context, draw_program_id);

		Utils::deleteTexture(m_context, compute_dst_tex_id);
		Utils::deleteTexture(m_context, compute_src_tex_id);
		Utils::deleteTexture(m_context, draw_dst_tex_id);
		Utils::deleteTexture(m_context, draw_src_tex_id);

		TCU_FAIL(exc.what());
	}

	gl.bindVertexArray(0);
	gl.bindFramebuffer(GL_DRAW_FRAMEBUFFER, 0);
	gl.useProgram(0);

	Utils::deleteProgram(m_context, compute_program_id);
	Utils::deleteProgram(m_context, draw_program_id);

	Utils::deleteTexture(m_context, compute_dst_tex_id);
	Utils::deleteTexture(m_context, compute_src_tex_id);
	Utils::deleteTexture(m_context, draw_dst_tex_id);
	Utils::deleteTexture(m_context, draw_src_tex_id);

	/* Done */
	return test_result;
}